

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  XYZ Ref;
  ELLIPSOID type_00;
  ELLIPSOID type_01;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  FILE *__stream;
  allocator aStack_2e5d9;
  string asStack_2e5d8 [32];
  double dStack_2e5b8;
  double dStack_2e5b0;
  double dStack_2e5a8;
  double dStack_2e5a0;
  double dStack_2e598;
  double dStack_2e590;
  XYZ XStack_2e580;
  undefined1 auStack_2e568 [8];
  SPP SppSolver_1;
  SatPos Solver_1;
  ELLIPSOID type_1;
  int flag_1;
  int desc;
  ReadData_conflict decoder_1;
  char *ip;
  stringstream asStack_173e0 [4];
  int port;
  stringstream tmp;
  ostream aoStack_173d0 [383];
  allocator aStack_17251;
  string asStack_17250 [8];
  string port_;
  allocator aStack_17229;
  string asStack_17228 [32];
  double dStack_17208;
  double dStack_17200;
  double dStack_171f8;
  double dStack_171f0;
  double dStack_171e8;
  double dStack_171e0;
  undefined1 auStack_171d8 [8];
  SPP SppSolver;
  SatPos Solver;
  undefined1 auStack_11a18 [4];
  int flag;
  ReadData_conflict decoder;
  ELLIPSOID type;
  FILE *file;
  char *filePath;
  allocator local_39;
  string local_38 [8];
  string command;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Usage: -i [IP address] [port]\n       -f [Binary File Path]");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"-f");
    if (bVar2) {
      if ((argc < 3) || (3 < argc)) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Usage: -f [Binary File Path]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      else {
        __stream = fopen(argv[2],"rb");
        ELLIPSOID::ELLIPSOID((ELLIPSOID *)&decoder.UserPsrPos.H);
        if (__stream == (FILE *)0x0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"open file error");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          exit(-1);
        }
        ReadData::ReadData((ReadData *)auStack_11a18);
        while (iVar3 = feof(__stream), iVar3 == 0) {
          iVar3 = ReadData::decode((ReadData *)auStack_11a18,(FILE *)__stream);
          if (iVar3 == 0) {
            SatPos::SatPos((SatPos *)&SppSolver.result.PDop);
            SPP::SPP((SPP *)auStack_171d8);
            dStack_171e8 = type.alpha;
            dStack_171e0 = type.e2;
            dStack_171f8 = type.b;
            dStack_171f0 = type.c;
            dStack_17208 = decoder.UserPsrPos.H;
            dStack_17200 = type.a;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(asStack_17228,"./",&aStack_17229);
            type_00.b = dStack_17200;
            type_00.a = dStack_17208;
            type_00.c = dStack_171f8;
            type_00.alpha = dStack_171f0;
            type_00.e2 = dStack_171e8;
            type_00.e1_2 = dStack_171e0;
            solve((SatPos *)&SppSolver.result.PDop,(SPP *)auStack_171d8,(ReadData *)auStack_11a18,
                  type_00,(string *)asStack_17228);
            std::__cxx11::string::~string(asStack_17228);
            std::allocator<char>::~allocator((allocator<char> *)&aStack_17229);
          }
        }
        argv_local._4_4_ = 0;
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"-i");
      if (bVar2) {
        if ((argc < 4) || (4 < argc)) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Usage: -i [IP address] [port]\n");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
        }
        else {
          pcVar1 = argv[3];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(asStack_17250,pcVar1,&aStack_17251);
          std::allocator<char>::~allocator((allocator<char> *)&aStack_17251);
          std::__cxx11::stringstream::stringstream(asStack_173e0);
          std::operator<<(aoStack_173d0,asStack_17250);
          std::istream::operator>>((istream *)asStack_173e0,(int *)((long)&ip + 4));
          pcVar1 = argv[2];
          ReadData::ReadData((ReadData *)&flag_1);
          type_1.e1_2._4_4_ = 0;
          argv_local._4_4_ =
               ReadData::OpenSocket
                         ((ReadData *)&flag_1,pcVar1,ip._4_4_,(int *)((long)&type_1.e1_2 + 4));
          type_1.e1_2._0_4_ = argv_local._4_4_;
          if (argv_local._4_4_ == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"waiting for data ...");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            do {
              do {
                type_1.e1_2._0_4_ = ReadData::decode((ReadData *)&flag_1,type_1.e1_2._4_4_);
              } while (type_1.e1_2._0_4_ != 0);
              ELLIPSOID::ELLIPSOID((ELLIPSOID *)&Solver_1.Bds[0x3f].Ekdot);
              SatPos::SatPos((SatPos *)&SppSolver_1.result.PDop);
              SPP::SPP((SPP *)auStack_2e568);
              XYZ::XYZ(&XStack_2e580,-2267800.069,5009341.6472,3220989.9179);
              Ref.Y = XStack_2e580.Y;
              Ref.X = XStack_2e580.X;
              Ref.Z = XStack_2e580.Z;
              SPP::setRefPos((SPP *)auStack_2e568,Ref);
              dStack_2e598 = type_1.alpha;
              dStack_2e590 = type_1.e2;
              dStack_2e5a8 = type_1.b;
              dStack_2e5a0 = type_1.c;
              dStack_2e5b8 = Solver_1.Bds[0x3f].Ekdot;
              dStack_2e5b0 = type_1.a;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(asStack_2e5d8,"./",&aStack_2e5d9);
              type_01.b = dStack_2e5b0;
              type_01.a = dStack_2e5b8;
              type_01.c = dStack_2e5a8;
              type_01.alpha = dStack_2e5a0;
              type_01.e2 = dStack_2e598;
              type_01.e1_2 = dStack_2e590;
              solve((SatPos *)&SppSolver_1.result.PDop,(SPP *)auStack_2e568,(ReadData *)&flag_1,
                    type_01,(string *)asStack_2e5d8);
              std::__cxx11::string::~string(asStack_2e5d8);
              std::allocator<char>::~allocator((allocator<char> *)&aStack_2e5d9);
            } while( true );
          }
          std::__cxx11::stringstream::~stringstream(asStack_173e0);
          std::__cxx11::string::~string(asStack_17250);
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "Usage: -i [IP address] [port]\n       -f [Binary File Path]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
    }
    std::__cxx11::string::~string(local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
    if(argc <= 1) {
        cout << "Usage: -i [IP address] [port]\n       -f [Binary File Path]" << endl;
        return 1;
    }
    string command = argv[1];

    if(command == "-f") {
        if(argc < 3 || argc >= 4) {
            cout << "Usage: -f [Binary File Path]" << endl;
            return 1;
        }
            
        char* filePath = argv[2];
        FILE* file = fopen(filePath, "rb");
        ELLIPSOID type;
        if(file == NULL) {
            cout << "open file error" << endl;
            exit(-1);
        }
        ReadData decoder;
        while(!feof(file)) {
            int flag = decoder.decode(file);
            if(flag != 0) 
                continue;
            SatPos Solver;
            SPP SppSolver;
            solve(Solver, SppSolver, decoder, type);
        }
        return 0;
    }

    else if(command == "-i") {
        if(argc < 4 || argc >= 5) {
            cout << "Usage: -i [IP address] [port]\n" << endl;
            return 1;
        }
        string port_ = argv[3];
        stringstream tmp;
        tmp << port_;
        int port;
        tmp >> port;
        char* ip = argv[2];

        ReadData decoder;
        int desc = 0;
        int flag = decoder.OpenSocket(ip, port, desc);
        if(flag != 0)
            return flag;
        cout << "waiting for data ..." << endl;
        while (true) {
            flag = decoder.decode(desc);
            if(flag != 0)
                continue;
            ELLIPSOID type;
            SatPos Solver;
            SPP SppSolver;
            SppSolver.setRefPos(XYZ(-2267800.0690, 5009341.6472, 3220989.9179));
            solve(Solver, SppSolver, decoder, type);
        }
    }
    else {
        cout << "Usage: -i [IP address] [port]\n       -f [Binary File Path]" << endl;
        return 1;
    }
    
}